

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_input.hpp
# Opt level: O0

void __thiscall
tao::pegtl::internal::mmap_holder::mmap_holder<char_const*&>(mmap_holder *this,char **in_filename)

{
  char *pcVar1;
  allocator local_19;
  char **local_18;
  char **in_filename_local;
  mmap_holder *this_local;
  
  pcVar1 = *in_filename;
  local_18 = in_filename;
  in_filename_local = (char **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  file_mapper::file_mapper(&this->data,pcVar1);
  return;
}

Assistant:

explicit mmap_holder( T&& in_filename )
               : filename( std::forward< T >( in_filename ) ),
                 data( filename.c_str() )
            {
            }